

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.h
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImplFactory<float>::BeagleCPU4StateImplFactory
          (BeagleCPU4StateImplFactory<float> *this)

{
  BeagleImplFactory *in_RDI;
  
  BeagleImplFactory::BeagleImplFactory(in_RDI);
  in_RDI->_vptr_BeagleImplFactory = (_func_int **)&PTR_createImpl_001ca078;
  return;
}

Assistant:

BEAGLE_CPU_FACTORY_TEMPLATE
class BeagleCPU4StateImplFactory : public BeagleImplFactory {
public:
    virtual BeagleImpl* createImpl(int tipCount,
                                   int partialsBufferCount,
                                   int compactBufferCount,
                                   int stateCount,
                                   int patternCount,
                                   int eigenBufferCount,
                                   int matrixBufferCount,
                                   int categoryCount,
                                   int scaleBufferCount,
                                   int resourceNumber,
                                   int pluginResourceNumber,
                                   long preferenceFlags,
                                   long requirementFlags,
                                   int* errorCode);

    virtual const char* getName();
    virtual const long getFlags();
}